

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O0

void __thiscall
TasGrid::HierarchyManipulations::SplitDirections::SplitDirections
          (SplitDirections *this,MultiIndexSet *points)

{
  anon_class_24_3_c938d288 __comp;
  int *a;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  reference piVar5;
  int *b;
  reference this_00;
  bool local_169;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f0;
  allocator<int> local_e1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  value_type_conflict3 local_bc;
  int *local_b8;
  int *p;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  iterator imap;
  allocator<int> local_61;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> map;
  size_t d;
  anon_class_8_1_de4efc64 doesBelongSameLine;
  size_t num_dimensions;
  int num_points;
  MultiIndexSet *points_local;
  SplitDirections *this_local;
  
  ::std::vector<int,_std::allocator<int>_>::vector(&this->job_directions);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->job_pnts);
  iVar2 = MultiIndexSet::getNumIndexes(points);
  doesBelongSameLine.num_dimensions = (size_t *)MultiIndexSet::getNumDimensions(points);
  d = (size_t)&doesBelongSameLine;
  for (map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < doesBelongSameLine.num_dimensions;
      map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    ::std::allocator<int>::allocator(&local_61);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_60,(long)iVar2,&local_61);
    ::std::allocator<int>::~allocator(&local_61);
    iVar3 = ::std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_60);
    iVar4 = ::std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_60);
    ::std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,0
              );
    iVar3 = ::std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_60);
    iVar4 = ::std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_60);
    __comp.num_dimensions = (size_t *)&doesBelongSameLine;
    __comp.points = points;
    __comp.d = (size_t *)
               &map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
    imap._M_current = (int *)points;
    ::std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::HierarchyManipulations::SplitDirections::SplitDirections(TasGrid::MultiIndexSet_const&)::__0>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
               __comp);
    local_a8._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_60);
    while( true ) {
      p = (int *)::std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_60);
      bVar1 = __gnu_cxx::operator!=
                        (&local_a8,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&p);
      if (!bVar1) break;
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_a8);
      local_b8 = MultiIndexSet::getIndex(points,*piVar5);
      local_bc = (value_type_conflict3)
                 map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      ::std::vector<int,_std::allocator<int>_>::push_back(&this->job_directions,&local_bc);
      local_e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++(&local_a8,0);
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_e0);
      ::std::allocator<int>::allocator(&local_e1);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_d8,1,piVar5,&local_e1);
      ::std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&this->job_pnts,&local_d8);
      ::std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
      ::std::allocator<int>::~allocator(&local_e1);
      while( true ) {
        local_f0._M_current =
             (int *)::std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_60);
        bVar1 = __gnu_cxx::operator!=(&local_a8,&local_f0);
        a = local_b8;
        local_169 = false;
        if (bVar1) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          b = MultiIndexSet::getIndex(points,*piVar5);
          local_169 = SplitDirections::anon_class_8_1_de4efc64::operator()
                                ((anon_class_8_1_de4efc64 *)&d,a,b,
                                 (size_t)map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
        }
        if (local_169 == false) break;
        this_00 = ::std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::back(&this->job_pnts);
        local_f8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++(&local_a8,0);
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_f8);
        ::std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar5);
      }
    }
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60)
    ;
  }
  return;
}

Assistant:

SplitDirections::SplitDirections(const MultiIndexSet &points){
    // split the points into "jobs", where each job represents a batch of
    // points that lay on a line in some direction
    // int    job_directions[i] gives the direction of the i-th job
    // vector job_pnts[i] gives a list of the points (using indexes within the set)
    int num_points = points.getNumIndexes();
    size_t num_dimensions = points.getNumDimensions();

    auto doesBelongSameLine = [&](const int a[], const int b[], size_t direction)->
                                    bool{
                                        for(size_t i=0; i<num_dimensions; i++)
                                            if ((i != direction) && (a[i] != b[i])) return false;
                                        return true;
                                    };

    for(size_t d=0; d<num_dimensions; d++){
        // working with direction d
        // sort all points but ignore index d
        std::vector<int> map(num_points);
        std::iota(map.begin(), map.end(), 0);
        std::sort(map.begin(), map.end(), [&](int a, int b)->bool{
            const int * idxa = points.getIndex(a);
            const int * idxb = points.getIndex(b);
            // lexigographical order ignoring dimension d
            for(size_t j=0; j<num_dimensions; j++)
                if (j != d){
                    if (idxa[j] < idxb[j]) return true;
                    if (idxa[j] > idxb[j]) return false;
                }
            return false;
        });

        auto imap = map.begin();
        while(imap != map.end()){
            // new job, get reference index
            const int *p = points.getIndex(*imap);
            job_directions.push_back((int) d);
            job_pnts.emplace_back(std::vector<int>(1, *imap++));
            // while the points are in the same direction as the reference, add to the same job
            while((imap != map.end()) && doesBelongSameLine(p, points.getIndex(*imap), d))
                job_pnts.back().push_back(*imap++);
        }
    }
}